

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O1

void CheckMempoolTRUCInvariants(CTxMemPool *tx_pool)

{
  CTxMemPoolEntry *pCVar1;
  long *plVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  CTxMemPoolEntry **ppCVar5;
  int64_t iVar6;
  _Rb_tree_node_base *p_Var7;
  pointer pTVar8;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  CTxMemPoolEntry *local_68;
  vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> local_60;
  unique_lock<std::recursive_mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_device = &(tx_pool->cs).super_recursive_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_48);
  CTxMemPool::infoAll(&local_60,tx_pool);
  if (local_60.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pTVar8 = local_60.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_68 = CTxMemPool::GetEntry
                           (tx_pool,&((pTVar8->tx).
                                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->hash);
      ppCVar5 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                          (&local_68,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                           ,0x94,"CheckMempoolTRUCInvariants",
                           "tx_pool.GetEntry(tx_info.tx->GetHash())");
      pCVar1 = *ppCVar5;
      if (((pTVar8->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          version == 3) {
        iVar6 = GetVirtualTransactionSize((long)pCVar1->nTxWeight,pCVar1->sigOpCost,nBytesPerSigOp);
        local_68._0_1_ = (int)iVar6 < 0x2711;
        inline_assertion_check<true,bool>
                  ((bool *)&local_68,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                   ,0x97,"CheckMempoolTRUCInvariants","entry.GetTxSize() <= TRUC_MAX_VSIZE");
        local_68._0_1_ = (ulong)pCVar1->m_count_with_descendants < 3;
        inline_assertion_check<true,bool>
                  ((bool *)&local_68,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                   ,0x9a,"CheckMempoolTRUCInvariants",
                   "entry.GetCountWithDescendants() <= TRUC_DESCENDANT_LIMIT");
        local_68._0_1_ = (ulong)pCVar1->m_count_with_ancestors < 3;
        inline_assertion_check<true,bool>
                  ((bool *)&local_68,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                   ,0x9b,"CheckMempoolTRUCInvariants",
                   "entry.GetCountWithAncestors() <= TRUC_ANCESTOR_LIMIT");
        local_68._0_1_ = pCVar1->nSizeWithDescendants < 0x2af9;
        inline_assertion_check<true,bool>
                  ((bool *)&local_68,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                   ,0x9c,"CheckMempoolTRUCInvariants",
                   "entry.GetSizeWithDescendants() <= TRUC_MAX_VSIZE + TRUC_CHILD_MAX_VSIZE");
        local_68 = (CTxMemPoolEntry *)CONCAT71(local_68._1_7_,pCVar1->nSizeWithAncestors < 0x2af9);
        inline_assertion_check<true,bool>
                  ((bool *)&local_68,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                   ,0x9d,"CheckMempoolTRUCInvariants",
                   "entry.GetSizeWithAncestors() <= TRUC_MAX_VSIZE + TRUC_CHILD_MAX_VSIZE");
        if (1 < (ulong)pCVar1->m_count_with_ancestors) {
          iVar6 = GetVirtualTransactionSize
                            ((long)pCVar1->nTxWeight,pCVar1->sigOpCost,nBytesPerSigOp);
          local_68._0_1_ = (int)iVar6 < 0x3e9;
          inline_assertion_check<true,bool>
                    ((bool *)&local_68,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                     ,0xa1,"CheckMempoolTRUCInvariants","entry.GetTxSize() <= TRUC_CHILD_MAX_VSIZE")
          ;
          plVar2 = *(long **)((pCVar1->m_parents)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_left + 1);
          lVar3 = *plVar2;
          p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar2[1];
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            }
          }
          local_68 = (CTxMemPoolEntry *)CONCAT71(local_68._1_7_,*(int *)(lVar3 + 0x30) == 3);
          inline_assertion_check<true,bool>
                    ((bool *)&local_68,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                     ,0xa4,"CheckMempoolTRUCInvariants",
                     "parents.begin()->get().GetSharedTx()->version == TRUC_VERSION");
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          }
        }
      }
      else if (1 < (ulong)pCVar1->m_count_with_ancestors) {
        for (p_Var7 = (pCVar1->m_parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var7 != &(pCVar1->m_parents)._M_t._M_impl.super__Rb_tree_header;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          lVar3 = **(long **)(p_Var7 + 1);
          p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long **)(p_Var7 + 1))[1];
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            }
          }
          local_68._1_7_ = (undefined7)((ulong)local_68 >> 8);
          local_68 = (CTxMemPoolEntry *)CONCAT71(local_68._1_7_,*(int *)(lVar3 + 0x30) != 3);
          inline_assertion_check<true,bool>
                    ((bool *)&local_68,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                     ,0xa9,"CheckMempoolTRUCInvariants",
                     "parent.get().GetSharedTx()->version != TRUC_VERSION");
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          }
        }
      }
      pTVar8 = pTVar8 + 1;
    } while (pTVar8 != local_60.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::~vector(&local_60);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CheckMempoolTRUCInvariants(const CTxMemPool& tx_pool)
{
    LOCK(tx_pool.cs);
    for (const auto& tx_info : tx_pool.infoAll()) {
        const auto& entry = *Assert(tx_pool.GetEntry(tx_info.tx->GetHash()));
        if (tx_info.tx->version == TRUC_VERSION) {
            // Check that special maximum virtual size is respected
            Assert(entry.GetTxSize() <= TRUC_MAX_VSIZE);

            // Check that special TRUC ancestor/descendant limits and rules are always respected
            Assert(entry.GetCountWithDescendants() <= TRUC_DESCENDANT_LIMIT);
            Assert(entry.GetCountWithAncestors() <= TRUC_ANCESTOR_LIMIT);
            Assert(entry.GetSizeWithDescendants() <= TRUC_MAX_VSIZE + TRUC_CHILD_MAX_VSIZE);
            Assert(entry.GetSizeWithAncestors() <= TRUC_MAX_VSIZE + TRUC_CHILD_MAX_VSIZE);

            // If this transaction has at least 1 ancestor, it's a "child" and has restricted weight.
            if (entry.GetCountWithAncestors() > 1) {
                Assert(entry.GetTxSize() <= TRUC_CHILD_MAX_VSIZE);
                // All TRUC transactions must only have TRUC unconfirmed parents.
                const auto& parents = entry.GetMemPoolParentsConst();
                Assert(parents.begin()->get().GetSharedTx()->version == TRUC_VERSION);
            }
        } else if (entry.GetCountWithAncestors() > 1) {
            // All non-TRUC transactions must only have non-TRUC unconfirmed parents.
            for (const auto& parent : entry.GetMemPoolParentsConst()) {
                Assert(parent.get().GetSharedTx()->version != TRUC_VERSION);
            }
        }
    }
}